

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_astDataType *
match_func_to_call(Context_conflict *ctx,MOJOSHADER_astExpressionCallFunction *ast)

{
  MOJOSHADER_astDataTypeType MVar1;
  char *key;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  MOJOSHADER_astDataType *pMVar9;
  MOJOSHADER_astDataType *pMVar10;
  MOJOSHADER_astDataType *pMVar11;
  int iVar12;
  MOJOSHADER_astArguments *pMVar13;
  int iVar14;
  void *pvVar15;
  ulong uVar16;
  void *pvVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  MOJOSHADER_astExpressionIdentifier *pMVar21;
  void *value;
  void *iter;
  void *local_70;
  int local_64;
  MOJOSHADER_astExpressionIdentifier *local_60;
  MOJOSHADER_astDataType *local_58;
  void *local_50;
  MOJOSHADER_astExpressionCallFunction *local_48;
  void *local_40;
  MOJOSHADER_astArguments *local_38;
  
  pMVar21 = ast->identifier;
  key = pMVar21->identifier;
  uVar18 = 0;
  local_70 = (void *)0x0;
  local_50 = (void *)0x0;
  pMVar13 = ast->args;
  local_48 = ast;
  if (pMVar13 != (MOJOSHADER_astArguments *)0x0) {
    uVar18 = 0;
    do {
      uVar18 = (ulong)((int)uVar18 + 1);
      type_check_ast(ctx,pMVar13->argument);
      pMVar13 = pMVar13->next;
    } while (pMVar13 != (MOJOSHADER_astArguments *)0x0);
  }
  iVar4 = hash_iter((ctx->variables).hash,key,&local_70,&local_50);
  if (iVar4 == 0) {
LAB_0014438c:
    failf(ctx,"No matching function named \'%s\'",key);
    pMVar9 = pMVar21->datatype;
  }
  else {
    iVar4 = (int)uVar18;
    local_64 = iVar4 * 4;
    iVar19 = 0;
    iVar14 = 0;
    pvVar15 = (void *)0x0;
    local_60 = pMVar21;
    do {
      pvVar2 = local_70;
      pMVar9 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)((long)local_70 + 8));
      if (pMVar9->type != MOJOSHADER_AST_DATATYPE_FUNCTION) {
        return pMVar9;
      }
      pvVar17 = pvVar15;
      iVar8 = iVar14;
      iVar3 = iVar19;
      local_58 = pMVar9;
      if (iVar4 == (pMVar9->function).num_params && iVar4 != 0) {
        local_40 = pvVar2;
        uVar16 = 0;
        iVar20 = 0;
        pMVar13 = local_48->args;
        do {
          if (pMVar13 == (MOJOSHADER_astArguments *)0x0) {
            __assert_fail("args != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x9b8,
                          "const MOJOSHADER_astDataType *match_func_to_call(Context *, MOJOSHADER_astExpressionCallFunction *)"
                         );
          }
          local_38 = pMVar13->next;
          pMVar10 = pMVar13->argument->datatype;
          pMVar11 = *(MOJOSHADER_astDataType **)((pMVar9->user).name + uVar16 * 8);
          iVar5 = datatypes_match(pMVar10,pMVar11);
          iVar12 = 4;
          if (iVar5 == 0) {
            pMVar9 = reduce_datatype(ctx,pMVar10);
            pMVar10 = reduce_datatype(ctx,pMVar11);
            MVar1 = pMVar9->type;
            if (MVar1 - MOJOSHADER_AST_DATATYPE_STRING < 0xfffffff8) {
              if (MVar1 != pMVar10->type) goto LAB_001442e8;
              if (MVar1 == MOJOSHADER_AST_DATATYPE_MATRIX) {
                if (((pMVar9->array).elements != (pMVar10->array).elements) ||
                   ((pMVar9->matrix).columns != (pMVar10->matrix).columns)) goto LAB_001442e8;
              }
              else if ((MVar1 != MOJOSHADER_AST_DATATYPE_VECTOR) ||
                      ((pMVar9->array).elements != (pMVar10->array).elements)) goto LAB_001442e8;
            }
            pMVar11 = reduce_datatype(ctx,pMVar9);
            if (pMVar11 == (MOJOSHADER_astDataType *)0x0) {
              pMVar11 = (MOJOSHADER_astDataType *)0x0;
            }
            else if (pMVar11->type - MOJOSHADER_AST_DATATYPE_ARRAY < 4) {
              pMVar11 = (pMVar11->array).base;
            }
            pMVar10 = reduce_datatype(ctx,pMVar10);
            if (pMVar10 == (MOJOSHADER_astDataType *)0x0) {
              pMVar10 = (MOJOSHADER_astDataType *)0x0;
            }
            else if (pMVar10->type - MOJOSHADER_AST_DATATYPE_ARRAY < 4) {
              pMVar10 = (pMVar10->array).base;
            }
            uVar6 = datatype_size((MOJOSHADER_astDataType *)(ulong)pMVar11->type);
            uVar7 = datatype_size((MOJOSHADER_astDataType *)(ulong)pMVar10->type);
            pMVar9 = local_58;
            if ((pMVar11->type - MOJOSHADER_AST_DATATYPE_HALF < 0xfffffffd) ||
               (iVar12 = 1, pMVar10->type - MOJOSHADER_AST_DATATYPE_FLOAT < 3)) {
              iVar12 = 3;
              if (uVar6 != uVar7) {
                iVar12 = (uVar6 < uVar7) + 1;
              }
            }
          }
          iVar20 = iVar20 + iVar12;
          uVar16 = uVar16 + 1;
          pMVar13 = local_38;
        } while (uVar18 != uVar16);
        if (local_38 == (MOJOSHADER_astArguments *)0x0) {
          if (iVar20 == local_64) {
            pvVar17 = local_40;
            if (local_40 != (void *)0x0) goto LAB_001443ab;
            goto LAB_00144413;
          }
          if ((iVar19 <= iVar20) &&
             (pvVar17 = local_40, iVar8 = 1, iVar3 = iVar20, iVar20 == iVar19)) {
            pvVar17 = pvVar15;
            iVar8 = iVar14 + 1;
            iVar3 = iVar19;
          }
        }
      }
LAB_001442e8:
      iVar19 = iVar3;
      iVar14 = iVar8;
      iVar8 = hash_iter((ctx->variables).hash,key,&local_70,&local_50);
      pvVar15 = pvVar17;
    } while (iVar8 != 0);
    if (iVar14 < 2) {
      if (pvVar17 == (void *)0x0) {
        if (iVar14 != 0) {
LAB_00144413:
          __assert_fail("match == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x9f0,
                        "const MOJOSHADER_astDataType *match_func_to_call(Context *, MOJOSHADER_astExpressionCallFunction *)"
                       );
        }
        pMVar21 = local_60;
        if (iVar19 != 0) {
          __assert_fail("best_score == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x9f1,
                        "const MOJOSHADER_astDataType *match_func_to_call(Context *, MOJOSHADER_astExpressionCallFunction *)"
                       );
        }
        goto LAB_0014438c;
      }
    }
    else {
      if (pvVar17 == (void *)0x0) {
        __assert_fail("best != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x9ea,
                      "const MOJOSHADER_astDataType *match_func_to_call(Context *, MOJOSHADER_astExpressionCallFunction *)"
                     );
      }
      failf(ctx,"Ambiguous function call to \'%s\'",key);
    }
LAB_001443ab:
    pMVar9 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)((long)pvVar17 + 8));
    local_60->datatype = pMVar9;
    local_60->index = *(int *)((long)pvVar17 + 0x10);
  }
  return pMVar9;
}

Assistant:

static const MOJOSHADER_astDataType *match_func_to_call(Context *ctx,
                                    MOJOSHADER_astExpressionCallFunction *ast)
{
    SymbolScope *best = NULL;  // best choice we find.
    int best_score = 0;
    MOJOSHADER_astExpressionIdentifier *ident = ast->identifier;
    const char *sym = ident->identifier;
    const void *value = NULL;
    void *iter = NULL;

    int argcount = 0;
    MOJOSHADER_astArguments *args = ast->args;
    while (args != NULL)
    {
        argcount++;
        type_check_ast(ctx, args->argument);
        args = args->next;
    } // while;

    // we do some tapdancing to handle function overloading here.
    int match = 0;
    while (hash_iter(ctx->variables.hash, sym, &value, &iter))
    {
        SymbolScope *item = (SymbolScope *) value;
        const MOJOSHADER_astDataType *dt = item->datatype;
        dt = reduce_datatype(ctx, dt);
        // there's a locally-scoped symbol with this name? It takes precedence.
        if (dt->type != MOJOSHADER_AST_DATATYPE_FUNCTION)
            return dt;

        const MOJOSHADER_astDataTypeFunction *dtfn = (MOJOSHADER_astDataTypeFunction *) dt;
        const int perfect = argcount * ((int) DT_MATCH_PERFECT);
        int score = 0;

        if (argcount == dtfn->num_params)  // !!! FIXME: default args.
        {
            args = ast->args;
            int i;
            for (i = 0; i < argcount; i++)
            {
                assert(args != NULL);
                dt = args->argument->datatype;
                args = args->next;
                const DatatypeMatch compatible = compatible_arg_datatype(ctx, dt, dtfn->params[i]);
                if (compatible == DT_MATCH_INCOMPATIBLE)
                {
                    args = NULL;
                    score = 0;
                    break;
                } // if

                score += (int) compatible;
            } // for

            if (args != NULL)
                score = 0;  // too many arguments supplied. No match.
        } // else

        if (score == 0)  // incompatible.
            continue;

        else if (score == perfect)  // perfection! stop looking!
        {
            match = 1;  // ignore all other compatible matches.
            best = item;
            break;
        } // if

        else if (score >= best_score)  // compatible, but not perfect, match.
        {
            if (score == best_score)
            {
                match++;
                // !!! FIXME: list each possible function in a fail(),
                // !!! FIXME:  but you can't actually fail() here, since
                // !!! FIXME:  this may cease to be ambiguous if we get
                // !!! FIXME:  a better match on a later overload.
            } // if

            else if (score > best_score)
            {
                match = 1;  // reset the ambiguousness count.
                best = item;
                best_score = score;
            } // if
        } // else if
    } // while

    if (match > 1)
    {
        assert(best != NULL);
        failf(ctx, "Ambiguous function call to '%s'", sym);
    } // if

    if (best == NULL)
    {
        assert(match == 0);
        assert(best_score == 0);
        // !!! FIXME: ident->datatype = ?
        failf(ctx, "No matching function named '%s'", sym);
    } // if
    else
    {
        ident->datatype = reduce_datatype(ctx, best->datatype);
        ident->index = best->index;
    } // else

    return ident->datatype;
}